

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool __thiscall
Js::FunctionBody::AllocProfiledForInLoopCount(FunctionBody *this,ProfileId *profileId)

{
  ProfileId PVar1;
  
  PVar1 = GetProfiledForInLoopCount(this);
  if (PVar1 != 0xffff) {
    *profileId = PVar1;
    IncreaseCountField(this,ProfiledForInLoopCount);
  }
  return PVar1 != 0xffff;
}

Assistant:

bool AllocProfiledForInLoopCount(ProfileId* profileId)
        {
            ProfileId profiledForInLoopCount = this->GetProfiledForInLoopCount();
            if (profiledForInLoopCount != Constants::NoProfileId)
            {
                *profileId = profiledForInLoopCount;
                this->IncreaseCountField(CounterFields::ProfiledForInLoopCount);
                return true;
            }
            return false;
        }